

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_lifetime.h
# Opt level: O0

void __thiscall
validation_layer::HandleLifetimeValidation::addHandle<_ze_rtas_builder_ext_handle_t*>
          (HandleLifetimeValidation *this,_ze_rtas_builder_ext_handle_t *handle)

{
  value_type *__x;
  void *local_38;
  _ze_rtas_builder_ext_handle_t *local_30;
  pair<void_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>
  local_28;
  _ze_rtas_builder_ext_handle_t *local_18;
  _ze_rtas_builder_ext_handle_t *handle_local;
  HandleLifetimeValidation *this_local;
  
  this->untrackedHandles = this->untrackedHandles + 1;
  local_38 = (void *)0x0;
  local_30 = handle;
  local_18 = handle;
  handle_local = (_ze_rtas_builder_ext_handle_t *)this;
  std::
  pair<void_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>
  ::pair<void_*,_std::nullptr_t,_true>(&local_28,&local_30,&local_38);
  std::
  unordered_map<void_*,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>_>
  ::insert((pair<std::__detail::_Node_iterator<std::pair<void_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_false,_false>,_bool>
            *)&this->defaultHandleStateMap,
           (unordered_map<void_*,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>_>
            *)&local_28,__x);
  std::
  pair<void_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>
  ::~pair(&local_28);
  return;
}

Assistant:

void addHandle(T handle) {
    // TODO : Log warning
    untrackedHandles++;
    defaultHandleStateMap.insert({static_cast<void *>(handle), nullptr});
  }